

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall ON_GeometryValue::WriteHelper(ON_GeometryValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(archive,(this->m_value).m_count);
    if (bVar1) {
      uVar4 = (ulong)(this->m_value).m_count;
      if ((long)uVar4 < 1) {
        bVar1 = true;
      }
      else {
        uVar3 = 1;
        do {
          bVar1 = ON_BinaryArchive::WriteObject
                            (archive,&(this->m_value).m_a[uVar3 - 1]->super_ON_Object);
          if (uVar4 <= uVar3) break;
          uVar3 = uVar3 + 1;
        } while (bVar1);
      }
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_GeometryValue::WriteHelper(ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = archive.WriteInt(m_value.Count());
    if (!rc) break;
    
    int i, count = m_value.Count();
    for( i = 0; i < count && rc; i++ )
    {
      rc = archive.WriteObject(m_value[i]);
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}